

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O1

int r1f3kb_(int *ido,int *l1,double *cc,int *in1,double *ch,int *in2,double *wa1,double *wa2)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  double *pdVar5;
  long lVar6;
  long lVar7;
  double *pdVar8;
  long lVar9;
  double *pdVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  double *pdVar15;
  long lVar16;
  int iVar17;
  double *pdVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  double *pdVar22;
  long lVar23;
  double *pdVar24;
  double *local_118;
  double *local_110;
  double *local_108;
  double *local_100;
  int local_f4;
  double *local_d0;
  double *local_c8;
  double *local_c0;
  double *local_b8;
  double *local_b0;
  double *local_a8;
  double *local_a0;
  double *local_98;
  double *local_90;
  double *local_88;
  double *local_80;
  
  iVar1 = *in1;
  lVar6 = (long)iVar1;
  iVar2 = *ido;
  lVar14 = (long)iVar2;
  lVar7 = (long)(~(iVar2 * 4) * iVar1 + -1);
  lVar9 = (long)*in2;
  iVar17 = *l1;
  lVar12 = (long)iVar17;
  uVar3 = iVar17 + 1;
  iVar4 = ~(uVar3 * iVar2) * *in2 + -1;
  if (0 < lVar12) {
    pdVar5 = cc + lVar7 + 1;
    pdVar8 = ch + (((ulong)(uint)(iVar17 * 3) + 1) * lVar14 + 1) * lVar9 + 1;
    lVar16 = lVar14 * lVar9;
    pdVar10 = ch + (((long)(iVar17 * 2) + 1) * lVar14 + 1) * lVar9 + 1;
    pdVar15 = ch + ((lVar12 + 1) * lVar14 + 1) * lVar9 + 1;
    iVar19 = iVar1 * iVar2 * 6;
    lVar21 = (lVar14 * 6 + 1) * lVar6;
    lVar11 = (lVar14 * 4 + 1) * lVar6;
    lVar23 = (ulong)uVar3 - 1;
    do {
      lVar20 = (long)iVar19;
      pdVar15[iVar4] = cc[lVar7 + lVar20 + 1] + cc[lVar7 + lVar20 + 1] + pdVar5[lVar11];
      pdVar10[iVar4] =
           pdVar5[lVar21] * -1.7320508075688774 +
           cc[lVar7 + lVar20 + 1] * -0.9999999999999996 + pdVar5[lVar11];
      pdVar8[iVar4] =
           pdVar5[lVar21] * 1.7320508075688774 +
           cc[lVar7 + lVar20 + 1] * -0.9999999999999996 + pdVar5[lVar11];
      pdVar8 = pdVar8 + lVar16;
      pdVar10 = pdVar10 + lVar16;
      pdVar15 = pdVar15 + lVar16;
      iVar19 = iVar19 + iVar1 * iVar2 * 3;
      pdVar5 = pdVar5 + lVar14 * lVar6 * 3;
      lVar23 = lVar23 + -1;
    } while (lVar23 != 0);
  }
  if (0 < iVar17 && iVar2 != 1) {
    local_80 = cc + (lVar14 * 5 + (long)(iVar2 + 2) + -3) * lVar6 + 1;
    lVar21 = lVar14 * lVar6;
    lVar11 = ((ulong)(uint)(iVar17 * 3) + 1) * lVar14;
    local_88 = ch + (lVar11 + 3) * lVar9 + 1;
    lVar16 = ((long)(iVar17 * 2) + 1) * lVar14;
    local_90 = ch + (lVar16 + 3) * lVar9 + 1;
    lVar12 = (lVar12 + 1) * lVar14;
    local_98 = cc + (lVar14 * 6 + 3) * lVar6 + 1;
    local_a0 = cc + (lVar14 * 4 + 3) * lVar6 + 1;
    local_a8 = cc + (lVar14 * 4 + 2) * lVar6 + 1;
    local_b0 = cc + (lVar14 * 6 + 2) * lVar6 + 1;
    local_b8 = ch + (lVar12 + 3) * lVar9 + 1;
    local_c0 = ch + (lVar12 + 2) * lVar9 + 1;
    local_c8 = ch + (lVar16 + 2) * lVar9 + 1;
    local_d0 = ch + (lVar11 + 2) * lVar9 + 1;
    local_f4 = (iVar2 * 6 + -2) * iVar1;
    lVar12 = lVar14 * lVar9;
    uVar13 = 1;
    do {
      if (2 < iVar2) {
        lVar11 = 3;
        local_100 = local_d0;
        local_108 = local_c8;
        local_110 = local_90;
        local_118 = local_88;
        pdVar5 = local_a8;
        pdVar8 = local_c0;
        pdVar10 = local_a0;
        pdVar15 = local_b8;
        pdVar18 = local_80;
        pdVar22 = local_b0;
        pdVar24 = local_98;
        iVar17 = local_f4;
        do {
          lVar16 = (long)iVar17;
          pdVar8[iVar4] = pdVar22[lVar7] + cc[lVar7 + lVar16 + 1] + pdVar5[lVar7];
          pdVar15[iVar4] = (pdVar24[lVar7] - pdVar18[lVar7]) + pdVar10[lVar7];
          local_108[iVar4] =
               ((pdVar24[lVar7] + pdVar18[lVar7]) * -0.8660254037844387 +
               (pdVar22[lVar7] + cc[lVar7 + lVar16 + 1]) * -0.4999999999999998 + pdVar5[lVar7]) *
               wa1[lVar11 + -3] -
               ((pdVar22[lVar7] - cc[lVar7 + lVar16 + 1]) * 0.8660254037844387 +
               (pdVar24[lVar7] - pdVar18[lVar7]) * -0.4999999999999998 + pdVar10[lVar7]) *
               wa1[lVar11 + -2];
          local_110[iVar4] =
               ((pdVar22[lVar7] - cc[lVar7 + lVar16 + 1]) * 0.8660254037844387 +
               (pdVar24[lVar7] - pdVar18[lVar7]) * -0.4999999999999998 + pdVar10[lVar7]) *
               wa1[lVar11 + -3] +
               ((pdVar24[lVar7] + pdVar18[lVar7]) * -0.8660254037844387 +
               (pdVar22[lVar7] + cc[lVar7 + lVar16 + 1]) * -0.4999999999999998 + pdVar5[lVar7]) *
               wa1[lVar11 + -2];
          local_100[iVar4] =
               ((pdVar24[lVar7] + pdVar18[lVar7]) * 0.8660254037844387 +
               (pdVar22[lVar7] + cc[lVar7 + lVar16 + 1]) * -0.4999999999999998 + pdVar5[lVar7]) *
               wa2[lVar11 + -3] -
               ((pdVar22[lVar7] - cc[lVar7 + lVar16 + 1]) * -0.8660254037844387 +
               (pdVar24[lVar7] - pdVar18[lVar7]) * -0.4999999999999998 + pdVar10[lVar7]) *
               wa2[lVar11 + -2];
          local_118[iVar4] =
               ((pdVar22[lVar7] - cc[lVar7 + lVar16 + 1]) * -0.8660254037844387 +
               (pdVar24[lVar7] - pdVar18[lVar7]) * -0.4999999999999998 + pdVar10[lVar7]) *
               wa2[lVar11 + -3] +
               ((pdVar24[lVar7] + pdVar18[lVar7]) * 0.8660254037844387 +
               (pdVar22[lVar7] + cc[lVar7 + lVar16 + 1]) * -0.4999999999999998 + pdVar5[lVar7]) *
               wa2[lVar11 + -2];
          lVar11 = lVar11 + 2;
          pdVar18 = pdVar18 + lVar6 * -2;
          iVar17 = iVar17 + iVar1 * -2;
          local_118 = local_118 + lVar9 * 2;
          local_110 = local_110 + lVar9 * 2;
          pdVar15 = pdVar15 + lVar9 * 2;
          pdVar24 = pdVar24 + lVar6 * 2;
          pdVar10 = pdVar10 + lVar6 * 2;
          pdVar5 = pdVar5 + lVar6 * 2;
          pdVar22 = pdVar22 + lVar6 * 2;
          pdVar8 = pdVar8 + lVar9 * 2;
          local_108 = local_108 + lVar9 * 2;
          local_100 = local_100 + lVar9 * 2;
        } while (lVar11 <= lVar14);
      }
      uVar13 = uVar13 + 1;
      local_80 = local_80 + lVar21 * 3;
      local_f4 = local_f4 + iVar1 * iVar2 * 3;
      local_88 = local_88 + lVar12;
      local_90 = local_90 + lVar12;
      local_b8 = local_b8 + lVar12;
      local_98 = local_98 + lVar21 * 3;
      local_a0 = local_a0 + lVar21 * 3;
      local_a8 = local_a8 + lVar21 * 3;
      local_b0 = local_b0 + lVar21 * 3;
      local_c0 = local_c0 + lVar12;
      local_c8 = local_c8 + lVar12;
      local_d0 = local_d0 + lVar12;
    } while (uVar13 != uVar3);
  }
  return 0;
}

Assistant:

int r1f3kb_(int *ido, int *l1, fft_real_t *cc, int *
	in1, fft_real_t *ch, int *in2, fft_real_t *wa1, fft_real_t *wa2)
{
    /* System generated locals */
    int cc_dim1, cc_dim2, cc_offset, ch_dim1, ch_dim2, ch_dim3, ch_offset,
	     i__1, i__2;

    /* Builtin functions */

    /* Local variables */
     int i__, k, ic;
     fft_real_t arg;
     int idp2;
     fft_real_t taui, taur;


    /* Parameter adjustments */
    --wa2;
    --wa1;
    cc_dim1 = *in1;
    cc_dim2 = *ido;
    cc_offset = 1 + cc_dim1 * (1 + (cc_dim2 << 2));
    cc -= cc_offset;
    ch_dim1 = *in2;
    ch_dim2 = *ido;
    ch_dim3 = *l1;
    ch_offset = 1 + ch_dim1 * (1 + ch_dim2 * (1 + ch_dim3));
    ch -= ch_offset;

    /* Function Body */
    arg = atan(1.0) * 8.0 / 3.0;
    taur = cos(arg);
    taui = sin(arg);
    i__1 = *l1;
    for (k = 1; k <= i__1; ++k) {
	ch[((k + ch_dim3) * ch_dim2 + 1) * ch_dim1 + 1] = cc[((k * 3 + 1) *
		cc_dim2 + 1) * cc_dim1 + 1] + cc[(*ido + (k * 3 + 2) *
		cc_dim2) * cc_dim1 + 1] * 2.0;
	ch[((k + (ch_dim3 << 1)) * ch_dim2 + 1) * ch_dim1 + 1] = cc[((k * 3 +
		1) * cc_dim2 + 1) * cc_dim1 + 1] + taur * 2.0 * cc[(*ido + (k
		* 3 + 2) * cc_dim2) * cc_dim1 + 1] - taui * 2.0 * cc[((k * 3
		+ 3) * cc_dim2 + 1) * cc_dim1 + 1];
	ch[((k + ch_dim3 * 3) * ch_dim2 + 1) * ch_dim1 + 1] = cc[((k * 3 + 1)
		* cc_dim2 + 1) * cc_dim1 + 1] + taur * 2.0 * cc[(*ido + (k *
		3 + 2) * cc_dim2) * cc_dim1 + 1] + taui * 2.0 * cc[((k * 3 +
		3) * cc_dim2 + 1) * cc_dim1 + 1];
/* L101: */
    }
    if (*ido == 1) {
	return 0;
    }
    idp2 = *ido + 2;
    i__1 = *l1;
    for (k = 1; k <= i__1; ++k) {
	i__2 = *ido;
	for (i__ = 3; i__ <= i__2; i__ += 2) {
	    ic = idp2 - i__;
	    ch[(i__ - 1 + (k + ch_dim3) * ch_dim2) * ch_dim1 + 1] = cc[(i__ -
		    1 + (k * 3 + 1) * cc_dim2) * cc_dim1 + 1] + (cc[(i__ - 1
		    + (k * 3 + 3) * cc_dim2) * cc_dim1 + 1] + cc[(ic - 1 + (k
		    * 3 + 2) * cc_dim2) * cc_dim1 + 1]);
	    ch[(i__ + (k + ch_dim3) * ch_dim2) * ch_dim1 + 1] = cc[(i__ + (k *
		     3 + 1) * cc_dim2) * cc_dim1 + 1] + (cc[(i__ + (k * 3 + 3)
		     * cc_dim2) * cc_dim1 + 1] - cc[(ic + (k * 3 + 2) *
		    cc_dim2) * cc_dim1 + 1]);
	    ch[(i__ - 1 + (k + (ch_dim3 << 1)) * ch_dim2) * ch_dim1 + 1] =
		    wa1[i__ - 2] * (cc[(i__ - 1 + (k * 3 + 1) * cc_dim2) *
		    cc_dim1 + 1] + taur * (cc[(i__ - 1 + (k * 3 + 3) *
		    cc_dim2) * cc_dim1 + 1] + cc[(ic - 1 + (k * 3 + 2) *
		    cc_dim2) * cc_dim1 + 1]) - taui * (cc[(i__ + (k * 3 + 3) *
		     cc_dim2) * cc_dim1 + 1] + cc[(ic + (k * 3 + 2) * cc_dim2)
		     * cc_dim1 + 1])) - wa1[i__ - 1] * (cc[(i__ + (k * 3 + 1)
		    * cc_dim2) * cc_dim1 + 1] + taur * (cc[(i__ + (k * 3 + 3)
		    * cc_dim2) * cc_dim1 + 1] - cc[(ic + (k * 3 + 2) *
		    cc_dim2) * cc_dim1 + 1]) + taui * (cc[(i__ - 1 + (k * 3 +
		    3) * cc_dim2) * cc_dim1 + 1] - cc[(ic - 1 + (k * 3 + 2) *
		    cc_dim2) * cc_dim1 + 1]));
	    ch[(i__ + (k + (ch_dim3 << 1)) * ch_dim2) * ch_dim1 + 1] = wa1[
		    i__ - 2] * (cc[(i__ + (k * 3 + 1) * cc_dim2) * cc_dim1 +
		    1] + taur * (cc[(i__ + (k * 3 + 3) * cc_dim2) * cc_dim1 +
		    1] - cc[(ic + (k * 3 + 2) * cc_dim2) * cc_dim1 + 1]) +
		    taui * (cc[(i__ - 1 + (k * 3 + 3) * cc_dim2) * cc_dim1 +
		    1] - cc[(ic - 1 + (k * 3 + 2) * cc_dim2) * cc_dim1 + 1]))
		    + wa1[i__ - 1] * (cc[(i__ - 1 + (k * 3 + 1) * cc_dim2) *
		    cc_dim1 + 1] + taur * (cc[(i__ - 1 + (k * 3 + 3) *
		    cc_dim2) * cc_dim1 + 1] + cc[(ic - 1 + (k * 3 + 2) *
		    cc_dim2) * cc_dim1 + 1]) - taui * (cc[(i__ + (k * 3 + 3) *
		     cc_dim2) * cc_dim1 + 1] + cc[(ic + (k * 3 + 2) * cc_dim2)
		     * cc_dim1 + 1]));
	    ch[(i__ - 1 + (k + ch_dim3 * 3) * ch_dim2) * ch_dim1 + 1] = wa2[
		    i__ - 2] * (cc[(i__ - 1 + (k * 3 + 1) * cc_dim2) *
		    cc_dim1 + 1] + taur * (cc[(i__ - 1 + (k * 3 + 3) *
		    cc_dim2) * cc_dim1 + 1] + cc[(ic - 1 + (k * 3 + 2) *
		    cc_dim2) * cc_dim1 + 1]) + taui * (cc[(i__ + (k * 3 + 3) *
		     cc_dim2) * cc_dim1 + 1] + cc[(ic + (k * 3 + 2) * cc_dim2)
		     * cc_dim1 + 1])) - wa2[i__ - 1] * (cc[(i__ + (k * 3 + 1)
		    * cc_dim2) * cc_dim1 + 1] + taur * (cc[(i__ + (k * 3 + 3)
		    * cc_dim2) * cc_dim1 + 1] - cc[(ic + (k * 3 + 2) *
		    cc_dim2) * cc_dim1 + 1]) - taui * (cc[(i__ - 1 + (k * 3 +
		    3) * cc_dim2) * cc_dim1 + 1] - cc[(ic - 1 + (k * 3 + 2) *
		    cc_dim2) * cc_dim1 + 1]));
	    ch[(i__ + (k + ch_dim3 * 3) * ch_dim2) * ch_dim1 + 1] = wa2[i__ -
		    2] * (cc[(i__ + (k * 3 + 1) * cc_dim2) * cc_dim1 + 1] +
		    taur * (cc[(i__ + (k * 3 + 3) * cc_dim2) * cc_dim1 + 1] -
		    cc[(ic + (k * 3 + 2) * cc_dim2) * cc_dim1 + 1]) - taui * (
		    cc[(i__ - 1 + (k * 3 + 3) * cc_dim2) * cc_dim1 + 1] - cc[(
		    ic - 1 + (k * 3 + 2) * cc_dim2) * cc_dim1 + 1])) + wa2[
		    i__ - 1] * (cc[(i__ - 1 + (k * 3 + 1) * cc_dim2) *
		    cc_dim1 + 1] + taur * (cc[(i__ - 1 + (k * 3 + 3) *
		    cc_dim2) * cc_dim1 + 1] + cc[(ic - 1 + (k * 3 + 2) *
		    cc_dim2) * cc_dim1 + 1]) + taui * (cc[(i__ + (k * 3 + 3) *
		     cc_dim2) * cc_dim1 + 1] + cc[(ic + (k * 3 + 2) * cc_dim2)
		     * cc_dim1 + 1]));
/* L102: */
	}
/* L103: */
    }
    return 0;
}